

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_InitGetElemI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Var object;
  Var elementName;
  Var getter;
  ScriptContext *scriptContext;
  OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  object = GetReg<unsigned_short>(this,playout->Instance);
  elementName = GetReg<unsigned_short>(this,playout->Element);
  getter = GetReg<unsigned_short>(this,playout->Value);
  scriptContext = FunctionProxy::GetScriptContext(*(FunctionProxy **)(this + 0x88));
  Js::JavascriptOperators::OP_InitElemGetter
            (object,elementName,getter,scriptContext,PropertyOperation_None);
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitGetElemI(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitElemGetter(
            GetReg(playout->Instance),
            GetReg(playout->Element),
            GetReg(playout->Value),
            m_functionBody->GetScriptContext()
        );
    }